

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPPVIndexValuePair.cpp
# Opt level: O1

string * __thiscall
JPPVIndexValuePair::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,JPPVIndexValuePair *this)

{
  ostream *poVar1;
  double extraout_XMM0_Qa;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"JPPVIndexValuePair: value=",0x1a);
  (*(this->super_JointPolicyValuePair).super_PolicyPoolItemInterface._vptr_PolicyPoolItemInterface
    [3])(this);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", jpolIndex:",0xc);
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string JPPVIndexValuePair::SoftPrint() const
{
    stringstream ss;
    ss << "JPPVIndexValuePair: value="<< GetValue() <<", jpolIndex:"; 
    ss << _m_jpolIndex;
    return(ss.str());
}